

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void clear(void)

{
  ulong uVar1;
  int j;
  ulong uVar2;
  int iVar3;
  
  start = true;
  iVar3 = bsize;
  for (uVar1 = 0; (long)uVar1 < (long)(iVar3 + 2); uVar1 = uVar1 + 1) {
    for (uVar2 = 0; (long)uVar2 < (long)(iVar3 + 2); uVar2 = uVar2 + 1) {
      board[uVar1][uVar2] =
           (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                (long)(iVar3 + 1)) *
           (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                (long)(iVar3 + 1)) == 0;
      points[uVar1][uVar2] = 0;
      iVar3 = bsize;
    }
  }
  return;
}

Assistant:

void clear() {
    start = true;
    for (int i = 0; i < bsize + 2; i++)
        for (int j = 0; j < bsize + 2; j++) {
            if ((i % (bsize + 1)) * (j % (bsize + 1)) == 0) board[i][j] = 1; else board[i][j] = 0;
            points[i][j] = 0;
        }
}